

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O1

CURLcode ntlm_decode_type2_target(Curl_easy *data,uchar *buffer,size_t size,ntlmdata *ntlm)

{
  unsigned_short uVar1;
  uint uVar2;
  void *__dest;
  
  uVar1 = 0;
  if (0x2f < size) {
    uVar1 = Curl_read16_le(buffer + 0x28);
    uVar2 = Curl_read32_le(buffer + 0x2c);
    if (uVar1 != 0) {
      if ((size <= uVar2) || (uVar2 < 0x30 || size < uVar2 + uVar1)) {
        Curl_infof(data,
                   "NTLM handshake failure (bad type-2 message). Target Info Offset Len is set incorrect by the peer\n"
                  );
        return CURLE_BAD_CONTENT_ENCODING;
      }
      __dest = (*Curl_cmalloc)((ulong)uVar1);
      ntlm->target_info = __dest;
      if (__dest == (void *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(__dest,buffer + uVar2,(ulong)uVar1);
    }
  }
  ntlm->target_info_len = (uint)uVar1;
  return CURLE_OK;
}

Assistant:

static CURLcode ntlm_decode_type2_target(struct Curl_easy *data,
                                         unsigned char *buffer,
                                         size_t size,
                                         struct ntlmdata *ntlm)
{
  unsigned short target_info_len = 0;
  unsigned int target_info_offset = 0;

#if defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void) data;
#endif

  if(size >= 48) {
    target_info_len = Curl_read16_le(&buffer[40]);
    target_info_offset = Curl_read32_le(&buffer[44]);
    if(target_info_len > 0) {
      if((target_info_offset >= size) ||
         ((target_info_offset + target_info_len) > size) ||
         (target_info_offset < 48)) {
        infof(data, "NTLM handshake failure (bad type-2 message). "
              "Target Info Offset Len is set incorrect by the peer\n");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      ntlm->target_info = malloc(target_info_len);
      if(!ntlm->target_info)
        return CURLE_OUT_OF_MEMORY;

      memcpy(ntlm->target_info, &buffer[target_info_offset], target_info_len);
    }
  }

  ntlm->target_info_len = target_info_len;

  return CURLE_OK;
}